

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true> __thiscall
duckdb::ReservoirSample::CreateNewSampleChunk
          (ReservoirSample *this,vector<duckdb::LogicalType,_true> *types,idx_t size)

{
  bool bVar1;
  DataChunk *this_00;
  Allocator *allocator;
  reference this_01;
  pointer pRVar2;
  reference pvVar3;
  idx_t in_RCX;
  idx_t col_idx;
  ulong __n;
  
  make_uniq<duckdb::ReservoirChunk>();
  this_00 = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
             operator->((unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                         *)this)->chunk;
  allocator = Allocator::DefaultAllocator();
  DataChunk::Initialize(this_00,allocator,(vector<duckdb::LogicalType,_true> *)size,in_RCX);
  for (__n = 0; __n < (ulong)((*(long *)(size + 8) - *(long *)size) / 0x18); __n = __n + 1) {
    this_01 = vector<duckdb::LogicalType,_true>::get<true>
                        ((vector<duckdb::LogicalType,_true> *)size,__n);
    bVar1 = LogicalType::IsNumeric(this_01);
    if ((!bVar1) &&
       (*(char *)&types[2].super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start == '\x01')) {
      pRVar2 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
               ::operator->((unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                             *)this);
      pvVar3 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)pRVar2,__n);
      Vector::SetVectorType(pvVar3,CONSTANT_VECTOR);
      pRVar2 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
               ::operator->((unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                             *)this);
      pvVar3 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)pRVar2,__n);
      ConstantVector::SetNull(pvVar3,true);
    }
  }
  return (unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>)
         (unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>)this;
}

Assistant:

unique_ptr<ReservoirChunk> ReservoirSample::CreateNewSampleChunk(vector<LogicalType> &types, idx_t size) const {
	auto new_sample_chunk = make_uniq<ReservoirChunk>();
	new_sample_chunk->chunk.Initialize(Allocator::DefaultAllocator(), types, size);

	// set the NULL columns correctly
	for (idx_t col_idx = 0; col_idx < types.size(); col_idx++) {
		if (!ValidSampleType(types[col_idx]) && stats_sample) {
			new_sample_chunk->chunk.data[col_idx].SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(new_sample_chunk->chunk.data[col_idx], true);
		}
	}
	return new_sample_chunk;
}